

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O2

void PA3Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  void *pvVar1;
  float left;
  float right;
  float bottom;
  float top;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_60;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pvVar1 = glfwGetWindowUserPointer(window);
  top = (float)framebufferHeight / (float)framebufferWidth;
  if (top <= 1.0) {
    bottom = -1.0;
    left = -1.0 / top;
    right = 1.0 / top;
    top = 1.0;
  }
  else {
    bottom = -top;
    left = -1.0;
    right = 1.0;
  }
  glm::ortho<float>((mat<4,_4,_float,_(glm::qualifier)0> *)&local_60.field_0,left,right,bottom,top);
  *(undefined4 *)((long)pvVar1 + 0x60) = local_30;
  *(undefined4 *)((long)pvVar1 + 100) = uStack_2c;
  *(undefined4 *)((long)pvVar1 + 0x68) = uStack_28;
  *(undefined4 *)((long)pvVar1 + 0x6c) = uStack_24;
  *(undefined4 *)((long)pvVar1 + 0x50) = local_40;
  *(undefined4 *)((long)pvVar1 + 0x54) = uStack_3c;
  *(undefined4 *)((long)pvVar1 + 0x58) = uStack_38;
  *(undefined4 *)((long)pvVar1 + 0x5c) = uStack_34;
  *(undefined4 *)((long)pvVar1 + 0x40) = local_50;
  *(undefined4 *)((long)pvVar1 + 0x44) = uStack_4c;
  *(undefined4 *)((long)pvVar1 + 0x48) = uStack_48;
  *(undefined4 *)((long)pvVar1 + 0x4c) = uStack_44;
  *(float *)((long)pvVar1 + 0x30) = local_60.field_0.x;
  *(float *)((long)pvVar1 + 0x34) = local_60.field_0.y;
  *(float *)((long)pvVar1 + 0x38) = local_60.field_0.z;
  *(float *)((long)pvVar1 + 0x3c) = local_60.field_0.w;
  glViewport(0,0,framebufferWidth,framebufferHeight);
  return;
}

Assistant:

void PA3Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA3Application & app = *static_cast<PA3Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferHeight / float(framebufferWidth);
  if (aspect > 1) {
    app.m_proj = glm::ortho(-1.f, 1.f, -aspect, aspect);
  } else {
    app.m_proj = glm::ortho(-1 / aspect, 1 / aspect, -1.f, 1.f);
  }
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}